

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solution.cpp
# Opt level: O0

void __thiscall Solution::deleteNursesAndTurns(Solution *this)

{
  Turn *this_00;
  NurseSolution *this_01;
  bool bVar1;
  reference __x;
  reference ppTVar2;
  reference ppVar3;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>
  *nurse;
  iterator __end1_1;
  iterator __begin1_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
  *__range1_1;
  Turn *turn;
  iterator __end2;
  iterator __begin2;
  vector<Turn_*,_std::allocator<Turn_*>_> *__range2;
  vector<Turn_*,_std::allocator<Turn_*>_> day;
  iterator __end1;
  iterator __begin1;
  vector<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
  *__range1;
  Solution *this_local;
  
  __end1 = std::
           vector<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
           ::begin(&this->turns);
  day.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)std::
                vector<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
                ::end(&this->turns);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::vector<Turn_*,_std::allocator<Turn_*>_>_*,_std::vector<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>_>
                                *)&day.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage);
    if (!bVar1) break;
    __x = __gnu_cxx::
          __normal_iterator<std::vector<Turn_*,_std::allocator<Turn_*>_>_*,_std::vector<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>_>
          ::operator*(&__end1);
    std::vector<Turn_*,_std::allocator<Turn_*>_>::vector
              ((vector<Turn_*,_std::allocator<Turn_*>_> *)&__range2,__x);
    __end2 = std::vector<Turn_*,_std::allocator<Turn_*>_>::begin
                       ((vector<Turn_*,_std::allocator<Turn_*>_> *)&__range2);
    turn = (Turn *)std::vector<Turn_*,_std::allocator<Turn_*>_>::end
                             ((vector<Turn_*,_std::allocator<Turn_*>_> *)&__range2);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<Turn_**,_std::vector<Turn_*,_std::allocator<Turn_*>_>_>
                                  *)&turn);
      if (!bVar1) break;
      ppTVar2 = __gnu_cxx::__normal_iterator<Turn_**,_std::vector<Turn_*,_std::allocator<Turn_*>_>_>
                ::operator*(&__end2);
      this_00 = *ppTVar2;
      if (this_00 != (Turn *)0x0) {
        Turn::~Turn(this_00);
        operator_delete(this_00,0x50);
      }
      __gnu_cxx::__normal_iterator<Turn_**,_std::vector<Turn_*,_std::allocator<Turn_*>_>_>::
      operator++(&__end2);
    }
    std::vector<Turn_*,_std::allocator<Turn_*>_>::~vector
              ((vector<Turn_*,_std::allocator<Turn_*>_> *)&__range2);
    __gnu_cxx::
    __normal_iterator<std::vector<Turn_*,_std::allocator<Turn_*>_>_*,_std::vector<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>_>
    ::operator++(&__end1);
  }
  __end1_1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
             ::begin(&this->nurses);
  nurse = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>
           *)std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
             ::end(&this->nurses);
  while( true ) {
    bVar1 = std::operator!=(&__end1_1,(_Self *)&nurse);
    if (!bVar1) break;
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>
             ::operator*(&__end1_1);
    this_01 = ppVar3->second;
    if (this_01 != (NurseSolution *)0x0) {
      NurseSolution::~NurseSolution(this_01);
      operator_delete(this_01,0x20);
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>
    ::operator++(&__end1_1);
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
  ::clear(&this->nurses);
  std::
  vector<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
  ::clear(&this->turns);
  return;
}

Assistant:

void Solution::deleteNursesAndTurns() {
    for(vector<Turn*> day : turns)
        for(Turn* turn : day)
            delete turn;
    for(auto const &nurse: nurses)
        delete nurse.second;

    nurses.clear();
    turns.clear();
}